

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove8<(moira::Instr)71,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort uVar1;
  AEStackFrame frame;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint n;
  ushort in_SI;
  Moira *in_RDI;
  AEStackFrame AVar5;
  u32 ea2;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u32 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffec;
  
  uVar4 = in_SI & 7;
  n = (int)(uint)in_SI >> 9 & 7;
  bVar3 = isMemMode(MODE_PD);
  if (bVar3) {
    bVar3 = readOp<(moira::Mode)4,(moira::Size)4,0ul>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffec,uVar4),n,
                       (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (!bVar3) {
      return;
    }
    bVar3 = NBIT<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.n = bVar3;
    bVar3 = ZERO<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.z = bVar3;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    uVar1 = (in_RDI->queue).irc;
    uVar4 = (uint)uVar1 << 0x10;
    readExt((Moira *)((ulong)CONCAT42(n,uVar1) << 0x10));
    uVar4 = (in_RDI->queue).irc | uVar4;
    bVar3 = misaligned<(moira::Size)4>(in_RDI,uVar4);
    if (bVar3) {
      AVar5 = makeFrame<40ul>((Moira *)CONCAT44(n,uVar4),in_stack_ffffffffffffffdc);
      uVar2 = AVar5._8_8_;
      frame.ird = (short)uVar4;
      frame.sr = (short)(uVar4 >> 0x10);
      frame.code = (short)uVar2;
      frame._2_2_ = (short)((ulong)uVar2 >> 0x10);
      frame.addr = (int)((ulong)uVar2 >> 0x20);
      frame.pc = n;
      execAddressError(AVar5._0_8_,frame,(int)((ulong)in_RDI >> 0x20));
      return;
    }
    bVar3 = NBIT<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.n = bVar3;
    bVar3 = ZERO<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.z = bVar3;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    writeM<(moira::Mode)8,(moira::Size)4,0ul>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    readExt((Moira *)CONCAT44(n,uVar4));
  }
  else {
    bVar3 = readOp<(moira::Mode)4,(moira::Size)4,0ul>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffec,uVar4),n,
                       (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (!bVar3) {
      return;
    }
    bVar3 = NBIT<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.n = bVar3;
    bVar3 = ZERO<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.z = bVar3;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    bVar3 = writeOp<(moira::Mode)8,(moira::Size)4,0ul>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    if (!bVar3) {
      return;
    }
  }
  prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void
Moira::execMove8(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is long absolute and the source
     *  operand is any memory addr.mode, step 4 is interleaved in the middle of
     *  step 3. Step 3 only performs a single prefetch in this case. The other
     *  prefetch cycle that is normally performed at that step is deferred
     *  after the write cycles. So, two prefetch cycles are performed after the
     *  write ones. It is a class 2 instruction. Note: The behavior is the same
     *  disregarding transfer size (byte, word or long). But if the source
     *  operand is a data or address register, or immediate, then the behavior
     *  is the same as other MOVE variants (class 1 instruction)."
     */
    if (isMemMode(M)) {
        
        if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
        
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        u32 ea2 = queue.irc << 16;
        readExt();
        ea2 |= queue.irc;

        if (misaligned<S>(ea2)) {
            execAddressError(makeFrame<AE_WRITE|AE_DATA>(ea2));
            return;
        }

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        writeM <MODE_AL,S> (ea2, data);
        readExt();
        
    } else {

        if (!readOp <M,S> (src, ea, data)) return;

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        if (!writeOp <MODE_AL,S> (dst, data)) return;
    }

    prefetch<POLLIPL>();
}